

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_shift_r(mbedtls_mpi *X,size_t count)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = count >> 6;
  bVar1 = (byte)count & 0x3f;
  uVar5 = X->n;
  if ((uVar3 <= uVar5) && ((count & 0x3f) == 0 || uVar3 != uVar5)) {
    if (0x3f < count) {
      for (uVar4 = 0; uVar4 < uVar5 - uVar3; uVar4 = uVar4 + 1) {
        X->p[uVar4] = X->p[uVar4 + uVar3];
        uVar5 = X->n;
      }
      for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        X->p[uVar4] = 0;
        uVar5 = X->n;
      }
    }
    if ((count & 0x3f) != 0) {
      uVar3 = 0;
      while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
        uVar4 = X->p[uVar5];
        X->p[uVar5] = uVar4 >> bVar1 | uVar3;
        uVar3 = uVar4 << (0x40 - bVar1 & 0x3f);
      }
    }
    return 0;
  }
  iVar2 = mbedtls_mpi_lset(X,0);
  return iVar2;
}

Assistant:

int mbedtls_mpi_shift_r( mbedtls_mpi *X, size_t count )
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if( v0 > X->n || ( v0 == X->n && v1 > 0 ) )
        return mbedtls_mpi_lset( X, 0 );

    /*
     * shift by count / limb_size
     */
    if( v0 > 0 )
    {
        for( i = 0; i < X->n - v0; i++ )
            X->p[i] = X->p[i + v0];

        for( ; i < X->n; i++ )
            X->p[i] = 0;
    }

    /*
     * shift by count % limb_size
     */
    if( v1 > 0 )
    {
        for( i = X->n; i > 0; i-- )
        {
            r1 = X->p[i - 1] << (biL - v1);
            X->p[i - 1] >>= v1;
            X->p[i - 1] |= r0;
            r0 = r1;
        }
    }

    return( 0 );
}